

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O2

void __thiscall xmrig::MinerPrivate::~MinerPrivate(MinerPrivate *this)

{
  Timer *this_00;
  pointer ppIVar1;
  pointer ppIVar2;
  
  this_00 = this->timer;
  if (this_00 != (Timer *)0x0) {
    Timer::~Timer(this_00);
  }
  operator_delete(this_00);
  ppIVar1 = (this->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->backends).
                 super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    if (*ppIVar2 != (IBackend *)0x0) {
      (*(*ppIVar2)->_vptr_IBackend[1])();
    }
  }
  String::~String(&this->userJobId);
  std::_Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::~_Vector_base
            (&(this->backends).
              super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>);
  Job::~Job(&this->job);
  return;
}

Assistant:

inline ~MinerPrivate()
    {
        delete timer;

        for (IBackend *backend : backends) {
            delete backend;
        }
    }